

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLDefectsTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLDefectsTest_strings_with_the_comment_syntax_in_them_breaks_the_parser_Test::
TestBody(OpenDDLDefectsTest_strings_with_the_comment_syntax_in_them_breaks_the_parser_Test *this)

{
  bool bVar1;
  size_t len;
  char *in_R9;
  AssertionResult gtest_ar_;
  OpenDDLParser myParser;
  char token [380];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  AssertHelper local_228;
  internal local_220 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  string local_210;
  OpenDDLParser local_1f0;
  char local_198 [392];
  
  memcpy(local_198,
         "Material $material1\n{\n    Name { string { \"defaultMat\" } }\n\n    Color( attrib = \"diffuse\" ) { float[ 3 ] {{0.6400000190734865, 0.6400000190734865, 0.6400000190734865}} }\n    Color( attrib = \"specular\" ) { float[ 3 ] {{0.5, 0.5, 0.5}} }\n    Param( attrib = \"specular_power\" ) { float { 50 } }\n\n    Texture( attrib = \"diffuse\" )\n    {\n        string { \"//f/kittylow.bmp\" }\n    }\n}\n"
         ,0x17c);
  OpenDDLParser::OpenDDLParser(&local_1f0);
  len = strlen(local_198);
  OpenDDLParser::setBuffer(&local_1f0,local_198,len);
  local_220[0] = (internal)OpenDDLParser::parse(&local_1f0);
  local_218.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_220[0]) {
    testing::Message::Message((Message *)&local_230);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_210,local_220,(AssertionResult *)"ok","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLDefectsTest.cpp"
               ,0x81,local_210._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_228,(Message *)&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_230.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_230.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_230.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_218,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  OpenDDLParser::~OpenDDLParser(&local_1f0);
  return;
}

Assistant:

TEST_F( OpenDDLDefectsTest, strings_with_the_comment_syntax_in_them_breaks_the_parser ) {
    char token[] = {
        "Material $material1\n"
        "{\n"
        "    Name { string { \"defaultMat\" } }\n"
        "\n"
        "    Color( attrib = \"diffuse\" ) { float[ 3 ] {{0.6400000190734865, 0.6400000190734865, 0.6400000190734865}} }\n"
        "    Color( attrib = \"specular\" ) { float[ 3 ] {{0.5, 0.5, 0.5}} }\n"
        "    Param( attrib = \"specular_power\" ) { float { 50 } }\n"
        "\n"
        "    Texture( attrib = \"diffuse\" )\n"
        "    {\n"
        "        string { \"//f/kittylow.bmp\" }\n"
        "    }\n"
        "}\n"
    };

    OpenDDLParser myParser;
    myParser.setBuffer( token, strlen( token ) );
    const bool ok( myParser.parse() );
    EXPECT_TRUE( ok );

}